

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O2

int libssh2_sign_sk(LIBSSH2_SESSION *session,uchar **sig,size_t *sig_len,uchar *data,size_t data_len
                   ,void **abstract)

{
  undefined4 *puVar1;
  int iVar2;
  uchar *puVar3;
  size_t sVar4;
  uchar *p;
  LIBSSH2_SK_SIG_INFO sig_info;
  uchar *x;
  
  puVar1 = (undefined4 *)*abstract;
  sig_info.sig_s_len = 0;
  sig_info.sig_r_len = 0;
  sig_info.sig_s = (uchar *)0x0;
  sig_info.flags = '\0';
  sig_info._1_3_ = 0;
  sig_info.counter = 0;
  sig_info.sig_r = (uchar *)0x0;
  if (*(long *)(puVar1 + 6) == 0) {
    return -0xc;
  }
  iVar2 = (**(code **)(puVar1 + 8))
                    (session,&sig_info,data,data_len,*puVar1,*(undefined1 *)(puVar1 + 1),puVar1[2],
                     puVar1[4],*(long *)(puVar1 + 6),*(undefined8 *)(puVar1 + 10));
  if (((iVar2 != 0) || (sig_info.sig_r_len == 0)) || (sig_info.sig_r == (uchar *)0x0)) {
    *sig_len = 0;
    return iVar2;
  }
  p = (uchar *)0x0;
  if ((sig_info.sig_s_len == 0) || (sig_info.sig_s == (uchar *)0x0)) {
    *sig_len = sig_info.sig_r_len + 9;
    puVar3 = (uchar *)(*session->alloc)(sig_info.sig_r_len + 9,&session->abstract);
    *sig = puVar3;
    if (puVar3 != (uchar *)0x0) {
      p = puVar3;
      _libssh2_store_str(&p,(char *)sig_info.sig_r,sig_info.sig_r_len);
      iVar2 = 0;
      goto LAB_00126dc6;
    }
  }
  else {
    sVar4 = sig_info.sig_r_len + sig_info.sig_s_len + 0x13;
    *sig_len = sVar4;
    puVar3 = (uchar *)(*session->alloc)(sVar4,&session->abstract);
    *sig = puVar3;
    if (puVar3 != (uchar *)0x0) {
      iVar2 = 0;
      p = puVar3;
      x = puVar3;
      _libssh2_store_u32(&p,0);
      _libssh2_store_bignum2_bytes(&p,sig_info.sig_r,sig_info.sig_r_len);
      _libssh2_store_bignum2_bytes(&p,sig_info.sig_s,sig_info.sig_s_len);
      puVar3 = *sig;
      *sig_len = (long)p - (long)puVar3;
      _libssh2_store_u32(&x,(int)((long)p - (long)puVar3) - 4);
      goto LAB_00126dc6;
    }
  }
  iVar2 = -6;
LAB_00126dc6:
  if (p != (uchar *)0x0) {
    *p = sig_info.flags;
    p = p + 1;
    _libssh2_store_u32(&p,sig_info.counter);
    *sig_len = (long)p - (long)*sig;
  }
  (*session->free)(sig_info.sig_r,&session->abstract);
  if (sig_info.sig_s != (uchar *)0x0) {
    (*session->free)(sig_info.sig_s,&session->abstract);
  }
  return iVar2;
}

Assistant:

int
libssh2_sign_sk(LIBSSH2_SESSION *session, unsigned char **sig, size_t *sig_len,
                const unsigned char *data, size_t data_len, void **abstract)
{
    int rc = LIBSSH2_ERROR_DECRYPT;
    LIBSSH2_PRIVKEY_SK *sk_info = (LIBSSH2_PRIVKEY_SK *) (*abstract);
    LIBSSH2_SK_SIG_INFO sig_info = { 0 };

    if(sk_info->handle_len <= 0) {
        return LIBSSH2_ERROR_DECRYPT;
    }

    rc = sk_info->sign_callback(session,
                                &sig_info,
                                data,
                                data_len,
                                sk_info->algorithm,
                                sk_info->flags,
                                sk_info->application,
                                sk_info->key_handle,
                                sk_info->handle_len,
                                sk_info->orig_abstract);

    if(rc == 0 && sig_info.sig_r_len > 0 && sig_info.sig_r) {
        unsigned char *p = NULL;

        if(sig_info.sig_s_len > 0 && sig_info.sig_s) {
            /* sig length, sig_r, sig_s, flags, counter, plus 4 bytes for each
               component's length, and up to 1 extra byte for each component */
            *sig_len = 4 + 5 + sig_info.sig_r_len + 5 + sig_info.sig_s_len + 5;
            *sig = LIBSSH2_ALLOC(session, *sig_len);

            if(*sig) {
                unsigned char *x = *sig;
                p = *sig;

                _libssh2_store_u32(&p, 0);

                _libssh2_store_bignum2_bytes(&p,
                                             sig_info.sig_r,
                                             sig_info.sig_r_len);

                _libssh2_store_bignum2_bytes(&p,
                                             sig_info.sig_s,
                                             sig_info.sig_s_len);

                *sig_len = p - *sig;

                _libssh2_store_u32(&x, (uint32_t)(*sig_len - 4));
            }
            else {
                _libssh2_debug((session,
                               LIBSSH2_ERROR_ALLOC,
                               "Unable to allocate ecdsa-sk signature."));
                rc = LIBSSH2_ERROR_ALLOC;
            }
        }
        else {
            /* sig, flags, counter, plus 4 bytes for sig length. */
            *sig_len = 4 + sig_info.sig_r_len + 1 + 4;
            *sig = LIBSSH2_ALLOC(session, *sig_len);

            if(*sig) {
                p = *sig;

                _libssh2_store_str(&p,
                                   (const char *)sig_info.sig_r,
                                   sig_info.sig_r_len);
            }
            else {
                _libssh2_debug((session,
                               LIBSSH2_ERROR_ALLOC,
                               "Unable to allocate ed25519-sk signature."));
                rc = LIBSSH2_ERROR_ALLOC;
            }
        }

        if(p) {
            *p = sig_info.flags;
            ++p;
            _libssh2_store_u32(&p, sig_info.counter);

            *sig_len = p - *sig;
        }

        LIBSSH2_FREE(session, sig_info.sig_r);

        if(sig_info.sig_s) {
            LIBSSH2_FREE(session, sig_info.sig_s);
        }
    }
    else {
        _libssh2_debug((session,
                       LIBSSH2_ERROR_DECRYPT,
                       "sign_callback failed or returned invalid signature."));
        *sig_len = 0;
    }

    return rc;
}